

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O0

void __thiscall
QStringBuilder<QStringBuilder<QString,_QLatin1Char>,_QString>::~QStringBuilder
          (QStringBuilder<QStringBuilder<QString,_QLatin1Char>,_QString> *this)

{
  QString::~QString((QString *)0x299a00);
  QStringBuilder<QString,_QLatin1Char>::~QStringBuilder
            ((QStringBuilder<QString,_QLatin1Char> *)0x299a0a);
  return;
}

Assistant:

~QStringBuilder() = default;